

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O0

void __thiscall
Inline::BuildIRForInlinee
          (Inline *this,Func *inlinee,JITTimeFunctionBody *funcBody,Instr *callInstr,
          bool isApplyTarget,uint recursiveInlineDepth)

{
  uint uVar1;
  Func *this_00;
  SymTable *this_01;
  anon_class_16_2_1f760866 callback;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  bool bVar5;
  ArgSlot AVar6;
  uint uVar7;
  RegSlot IDIncrease;
  JITTimeFunctionBody *pJVar8;
  JITTimeFunctionBody *pJVar9;
  intptr_t iVar10;
  intptr_t iVar11;
  uint local_45c;
  undefined1 local_408 [6];
  ArgSlot formalCount;
  Inline recursiveInliner;
  IRBuilder irBuilder_1;
  IRBuilderAsmJs irBuilder;
  undefined1 local_d8 [8];
  AutoCodeGenPhase __autoCodeGen;
  Instr *pIStack_b8;
  Instr *argOuts [15];
  ArgSlot local_32;
  uint local_30;
  ArgSlot actualsCount;
  uint recursiveInlineDepth_local;
  bool isApplyTarget_local;
  Instr *callInstr_local;
  JITTimeFunctionBody *funcBody_local;
  Func *inlinee_local;
  Inline *this_local;
  
  this_00 = this->topFunc;
  uVar1 = this->currentForInDepth;
  local_30 = recursiveInlineDepth;
  actualsCount._1_1_ = isApplyTarget;
  _recursiveInlineDepth_local = callInstr;
  callInstr_local = (Instr *)funcBody;
  funcBody_local = (JITTimeFunctionBody *)inlinee;
  inlinee_local = (Func *)this;
  uVar7 = JITTimeFunctionBody::GetForInLoopDepth(funcBody);
  Func::UpdateForInLoopMaxDepth(this_00,uVar1 + uVar7);
  uVar2 = *(undefined1 *)((long)&this->currentForInDepth + 1);
  uVar3 = *(undefined1 *)((long)&this->currentForInDepth + 2);
  uVar4 = *(undefined1 *)((long)&this->currentForInDepth + 3);
  funcBody_local[1].m_bodyData.isGlobalFunc = *(undefined1 *)&this->currentForInDepth;
  funcBody_local[1].m_bodyData.isInlineApplyDisabled = uVar2;
  funcBody_local[1].m_bodyData.doJITLoopBody = uVar3;
  funcBody_local[1].m_bodyData.disableInlineSpread = uVar4;
  local_32 = 0;
  argOuts[0xd] = (Instr *)0xfefefefefefefefe;
  argOuts[0xb] = (Instr *)0xfefefefefefefefe;
  argOuts[0xc] = (Instr *)0xfefefefefefefefe;
  argOuts[9] = (Instr *)0xfefefefefefefefe;
  argOuts[10] = (Instr *)0xfefefefefefefefe;
  argOuts[7] = (Instr *)0xfefefefefefefefe;
  argOuts[8] = (Instr *)0xfefefefefefefefe;
  argOuts[5] = (Instr *)0xfefefefefefefefe;
  argOuts[6] = (Instr *)0xfefefefefefefefe;
  argOuts[3] = (Instr *)0xfefefefefefefefe;
  argOuts[4] = (Instr *)0xfefefefefefefefe;
  argOuts[1] = (Instr *)0xfefefefefefefefe;
  argOuts[2] = (Instr *)0xfefefefefefefefe;
  pIStack_b8 = (Instr *)0xfefefefefefefefe;
  argOuts[0] = (Instr *)0xfefefefefefefefe;
  __autoCodeGen._8_8_ = &pIStack_b8;
  callback.actualsCount = &local_32;
  callback.argOuts = (Instr *(*) [15])__autoCodeGen._8_8_;
  IR::Instr::
  IterateArgInstrs<Inline::BuildIRForInlinee(Func*,JITTimeFunctionBody*,IR::Instr*,bool,unsigned_int)::__0>
            (_recursiveInlineDepth_local,callback);
  *(ArgSlot *)&funcBody_local[1].m_bodyData.nestedCount = local_32;
  *(SymTable **)&funcBody_local[1].m_bodyData = this->topFunc->m_symTable;
  SymTable::SetIDAdjustment(*(SymTable **)&funcBody_local[1].m_bodyData);
  this_01 = *(SymTable **)&funcBody_local[1].m_bodyData;
  IDIncrease = JITTimeFunctionBody::GetLocalsCount((JITTimeFunctionBody *)callInstr_local);
  SymTable::IncreaseStartingID(this_01,IDIncrease);
  AutoCodeGenPhase::AutoCodeGenPhase((AutoCodeGenPhase *)local_d8,this->topFunc,IRBuilderPhase);
  pJVar8 = Func::GetJITFunctionBody(this->topFunc);
  bVar5 = JITTimeFunctionBody::IsAsmJsMode(pJVar8);
  if (bVar5) {
    IRBuilderAsmJs::IRBuilderAsmJs
              ((IRBuilderAsmJs *)&irBuilder_1.m_generatorJumpTable.m_generatorFrameOpnd,
               (Func *)funcBody_local);
    IRBuilderAsmJs::Build((IRBuilderAsmJs *)&irBuilder_1.m_generatorJumpTable.m_generatorFrameOpnd);
  }
  else {
    IRBuilder::IRBuilder((IRBuilder *)&recursiveInliner.prevFrameCallInstr,(Func *)funcBody_local);
    IRBuilder::Build((IRBuilder *)&recursiveInliner.prevFrameCallInstr);
    IRBuilder::~IRBuilder((IRBuilder *)&recursiveInliner.prevFrameCallInstr);
  }
  AutoCodeGenPhase::EndPhase((AutoCodeGenPhase *)local_d8,this->topFunc,IRBuilderPhase,false,true);
  AutoCodeGenPhase::~AutoCodeGenPhase((AutoCodeGenPhase *)local_d8);
  SymTable::ClearIDAdjustment(*(SymTable **)&funcBody_local[1].m_bodyData);
  Inline((Inline *)local_408,this->topFunc,this->inliningHeuristics,this->isInLoop,
         this->currentInlineeFrameSlot + 3 + (uint)local_32,(bool)(actualsCount._1_1_ & 1),this,
         _recursiveInlineDepth_local);
  pJVar8 = funcBody_local;
  AVar6 = local_32;
  pJVar9 = Func::GetJITFunctionBody((Func *)funcBody_local);
  iVar10 = JITTimeFunctionBody::GetAddr(pJVar9);
  pJVar9 = Func::GetJITFunctionBody(_recursiveInlineDepth_local->m_func);
  iVar11 = JITTimeFunctionBody::GetAddr(pJVar9);
  if (iVar10 == iVar11) {
    local_45c = local_30 + 1;
  }
  else {
    local_45c = 0;
  }
  Optimize((Inline *)local_408,(Func *)pJVar8,&pIStack_b8,AVar6,local_45c);
  AVar6 = JITTimeFunctionBody::GetInParamsCount((JITTimeFunctionBody *)callInstr_local);
  if (0xf < AVar6) {
    Js::Throw::FatalInternalError(-0x7fffbffb);
  }
  return;
}

Assistant:

void
Inline::BuildIRForInlinee(Func *inlinee, JITTimeFunctionBody *funcBody, IR::Instr *callInstr, bool isApplyTarget, uint recursiveInlineDepth)
{
    // Update for..in max depth for the whole function
    this->topFunc->UpdateForInLoopMaxDepth(this->currentForInDepth + funcBody->GetForInLoopDepth());

    // Set for..in base depth of inlinee
    inlinee->m_forInLoopBaseDepth = this->currentForInDepth;

    Js::ArgSlot actualsCount = 0;
    IR::Instr *argOuts[Js::InlineeCallInfo::MaxInlineeArgoutCount];
#if DBG
    memset(argOuts, 0xFE, sizeof(argOuts));
#endif

    callInstr->IterateArgInstrs([&](IR::Instr* argInstr){
        StackSym *argSym = argInstr->GetDst()->AsSymOpnd()->m_sym->AsStackSym();
        argOuts[argSym->GetArgSlotNum() - 1] = argInstr;
        actualsCount++;
        return false;
    });

    inlinee->actualCount = actualsCount;

    inlinee->m_symTable = this->topFunc->m_symTable;

    inlinee->m_symTable->SetIDAdjustment();
    inlinee->m_symTable->IncreaseStartingID(funcBody->GetLocalsCount());

    BEGIN_CODEGEN_PHASE(this->topFunc, Js::IRBuilderPhase);

#ifdef ASMJS_PLAT
    if (this->topFunc->GetJITFunctionBody()->IsAsmJsMode())
    {
        IRBuilderAsmJs irBuilder(inlinee);
        irBuilder.Build();
    }
    else
#endif
    {
        IRBuilder irBuilder(inlinee);
        irBuilder.Build();
    }

    END_CODEGEN_PHASE_NO_DUMP(this->topFunc, Js::IRBuilderPhase);

    inlinee->m_symTable->ClearIDAdjustment();

    Inline recursiveInliner(this->topFunc, this->inliningHeuristics, this->isInLoop, currentInlineeFrameSlot + Js::Constants::InlineeMetaArgCount + actualsCount, isApplyTarget, this, callInstr);
    recursiveInliner.Optimize(inlinee, argOuts, actualsCount, inlinee->GetJITFunctionBody()->GetAddr() == callInstr->m_func->GetJITFunctionBody()->GetAddr() ? recursiveInlineDepth + 1 : 0);

#ifdef DBG
    Js::ArgSlot formalCount = funcBody->GetInParamsCount();

    if (formalCount > Js::InlineeCallInfo::MaxInlineeArgoutCount)
    {
        Fatal();
    }
#endif
}